

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckSvgAttr(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  TidyAttrId TVar1;
  Attribute *pAVar2;
  int iVar3;
  Bool BVar4;
  uint code;
  ctmbstr *list;
  bool bVar5;
  
  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_SVG)) {
    code = 0x227;
LAB_0013eb82:
    prvTidyReportAttrError(doc,node,attval,code);
    return;
  }
  if ((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) {
    return;
  }
  TVar1 = attval->dict->id;
  bVar5 = TVar1 == TidyAttr_COLOR;
  if (((((!bVar5) && (bVar5 = TVar1 == TidyAttr_FILL, !bVar5)) &&
       ((bVar5 = TVar1 == TidyAttr_FILLRULE, !bVar5 &&
        ((((bVar5 = TVar1 == TidyAttr_STROKE, !bVar5 &&
           (bVar5 = TVar1 == TidyAttr_STROKEDASHARRAY, !bVar5)) &&
          (bVar5 = TVar1 == TidyAttr_STROKEDASHOFFSET, !bVar5)) &&
         ((bVar5 = TVar1 == TidyAttr_STROKELINECAP, !bVar5 &&
          (bVar5 = TVar1 == TidyAttr_STROKELINEJOIN, !bVar5)))))))) &&
      (bVar5 = TVar1 == TidyAttr_STROKEMITERLIMIT, !bVar5)) &&
     (((bVar5 = TVar1 == TidyAttr_STROKEWIDTH, !bVar5 &&
       (bVar5 = TVar1 == TidyAttr_COLORINTERPOLATION, !bVar5)) &&
      ((bVar5 = TVar1 == TidyAttr_COLORRENDERING, !bVar5 &&
       (bVar5 = TVar1 == TidyAttr_OPACITY, !bVar5)))))) {
    bVar5 = (TVar1 & ~TidyAttr_ABBR) == TidyAttr_STROKEOPACITY;
  }
  if (!bVar5) {
    return;
  }
  if ((attval == (AttVal *)0x0) || (attval->value == (ctmbstr)0x0)) {
    code = 0x256;
    goto LAB_0013eb82;
  }
  iVar3 = prvTidytmbstrcasecmp(attval->value,"inherit");
  if (iVar3 == 0) {
    return;
  }
  pAVar2 = attval->dict;
  if (pAVar2 == (Attribute *)0x0) {
    return;
  }
  if (pAVar2->id != TidyAttr_FILL) {
    if (pAVar2 == (Attribute *)0x0) {
      return;
    }
    if (pAVar2->id != TidyAttr_STROKE) {
      if (pAVar2 == (Attribute *)0x0) {
        return;
      }
      if (pAVar2->id == TidyAttr_FILLRULE) {
        list = CheckSvgAttr::values_1;
      }
      else {
        if (pAVar2 == (Attribute *)0x0) {
          return;
        }
        if (pAVar2->id == TidyAttr_STROKEDASHARRAY) {
          BVar4 = AttrValueIsAmong(attval,CheckSvgAttr::values_2);
          if (BVar4 == no) {
            return;
          }
          goto LAB_0013eb61;
        }
        if (pAVar2 == (Attribute *)0x0) {
          return;
        }
        if (pAVar2->id == TidyAttr_STROKEDASHOFFSET) {
LAB_0013ec21:
          CheckLength(doc,node,attval);
          return;
        }
        if (pAVar2 == (Attribute *)0x0) {
          return;
        }
        if (pAVar2->id == TidyAttr_STROKELINECAP) {
          list = CheckSvgAttr::values_3;
        }
        else {
          if (pAVar2 == (Attribute *)0x0) {
            return;
          }
          if (pAVar2->id == TidyAttr_STROKELINEJOIN) {
            list = CheckSvgAttr::values_4;
          }
          else {
            if (pAVar2 == (Attribute *)0x0) {
              return;
            }
            if (pAVar2->id == TidyAttr_STROKEMITERLIMIT) {
              CheckNumber(doc,node,attval);
              return;
            }
            if (pAVar2 == (Attribute *)0x0) {
              return;
            }
            if (pAVar2->id == TidyAttr_STROKEWIDTH) goto LAB_0013ec21;
            if (pAVar2 == (Attribute *)0x0) {
              return;
            }
            if (pAVar2->id == TidyAttr_COLORINTERPOLATION) {
              list = CheckSvgAttr::values_5;
            }
            else {
              if (pAVar2 == (Attribute *)0x0) {
                return;
              }
              if (pAVar2->id != TidyAttr_COLORRENDERING) {
                if (pAVar2 == (Attribute *)0x0) {
                  return;
                }
                if (pAVar2->id != TidyAttr_OPACITY) {
                  if (pAVar2 == (Attribute *)0x0) {
                    return;
                  }
                  if (pAVar2->id != TidyAttr_STROKEOPACITY) {
                    if (pAVar2 == (Attribute *)0x0) {
                      return;
                    }
                    if (pAVar2->id != TidyAttr_FILLOPACITY) {
                      return;
                    }
                  }
                }
                CheckDecimal(doc,node,attval);
                return;
              }
              list = CheckSvgAttr::values_6;
            }
          }
        }
      }
      BVar4 = AttrValueIsAmong(attval,list);
      if (BVar4 == no) {
        code = 0x22b;
        goto LAB_0013eb82;
      }
      goto LAB_0013eb61;
    }
  }
  BVar4 = AttrValueIsAmong(attval,CheckSvgAttr::values);
  if (BVar4 == no) {
    CheckColor(doc,node,attval);
    return;
  }
LAB_0013eb61:
  CheckLowerCaseAttrValue(doc,node,attval);
  return;
}

Assistant:

static void CheckSvgAttr( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    if (!nodeIsSVG(node))
    {
        TY_(ReportAttrError)(doc, node, attval, ATTRIBUTE_IS_NOT_ALLOWED);
        return;
    }

    /* Issue #903 - check SVG paint attributes */
    if (IsSvgPaintAttr(attval))
    {
        /* all valid paint attributes have values */
        if (!AttrHasValue(attval))
        {
            TY_(ReportAttrError)(doc, node, attval, MISSING_ATTR_VALUE);
            return;
        }
        /* all paint attributes support an 'inherit' value,
        per https://dev.w3.org/SVG/profiles/1.1F2/publish/painting.html#SpecifyingPaint */
        if (AttrValueIs(attval, "inherit"))
        {
            return;
        }

        /* check paint datatypes
        see https://dev.w3.org/SVG/profiles/1.1F2/publish/painting.html#SpecifyingPaint
        */
        if (attrIsSVG_FILL(attval) || attrIsSVG_STROKE(attval))
        {
            /* TODO: support funciri */
            static ctmbstr const values[] = {
                "none", "currentColor", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                CheckColor(doc, node, attval);
        } 
        else if (attrIsSVG_FILLRULE(attval))
        {
            static ctmbstr const values[] = {"nonzero", "evenodd", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_STROKEDASHARRAY(attval))
        {
            static ctmbstr const values[] = {"none", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
            {
                /* TODO: process dash arrays */
            }
        }
        else if (attrIsSVG_STROKEDASHOFFSET(attval))
        {
            CheckLength(doc, node, attval);
        }
        else if (attrIsSVG_STROKELINECAP(attval))
        {
            static ctmbstr const values[] = {"butt", "round", "square", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_STROKELINEJOIN(attval))
        {
            static ctmbstr const values[] = {"miter", "round", "bevel", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_STROKEMITERLIMIT(attval))
        {
            CheckNumber(doc, node, attval);
        }
        else if (attrIsSVG_STROKEWIDTH(attval))
        {
            CheckLength(doc, node, attval);
        }
        else if (attrIsSVG_COLORINTERPOLATION(attval))
        {
            static ctmbstr const values[] = {"auto", "sRGB", "linearRGB", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_COLORRENDERING(attval))
        {
            static ctmbstr const values[] = {
                "auto", "optimizeSpeed", "optimizeQuality", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if(attrIsSVG_OPACITY(attval))
        {
            CheckDecimal(doc, node, attval);
        }
        else if(attrIsSVG_STROKEOPACITY(attval))
        {
            CheckDecimal(doc, node, attval);
        }
        else if(attrIsSVG_FILLOPACITY(attval))
        {
            CheckDecimal(doc, node, attval);
        }
    }
}